

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Struct * __thiscall hdc::Parser::parse_struct(Parser *this)

{
  bool bVar1;
  Struct *this_00;
  IdentifierExpression *parent;
  Type *type;
  StructField *this_01;
  Token name;
  
  name.lexem._M_dataplus._M_p = (pointer)&name.lexem.field_2;
  name.lexem._M_string_length = 0;
  name.lexem.field_2._M_local_buf[0] = '\0';
  this_00 = (Struct *)operator_new(0x78);
  Struct::Struct(this_00);
  expect(this,TK_STRUCT);
  expect(this,TK_ID);
  Struct::setName(this_00,(this->matched)._M_current);
  bVar1 = match(this,TK_LEFT_PARENTHESIS);
  if (bVar1) {
    parent = parse_identifier_expression(this);
    Struct::setSuperStruct(this_00,parent);
    expect(this,TK_RIGHT_PARENTHESIS);
  }
  expect(this,TK_COLON);
  expect(this,TK_NEWLINE);
  expect(this,TK_BEGIN);
  bVar1 = match(this,TK_PASS);
  if (!bVar1) {
    while( true ) {
      bVar1 = match(this,TK_ID);
      if (!bVar1) break;
      Token::operator=(&name,(this->matched)._M_current);
      expect(this,TK_COLON);
      type = parse_type(this);
      expect(this,TK_NEWLINE);
      this_01 = (StructField *)operator_new(0x68);
      StructField::StructField(this_01,&name,type);
      Struct::addField(this_00,this_01);
    }
  }
  expect(this,TK_END);
  std::__cxx11::string::~string((string *)&name.lexem);
  return this_00;
}

Assistant:

Struct*Parser::parse_struct() {
    Token name;
    Type* type;
    Struct* s = new Struct();

    expect(TK_STRUCT);
    expect(TK_ID);
    s->setName(*matched);

    if (match(TK_LEFT_PARENTHESIS)) {
        s->setSuperStruct(parse_identifier_expression());
        expect(TK_RIGHT_PARENTHESIS);
    }

    expect(TK_COLON);
    expect(TK_NEWLINE);
    expect(TK_BEGIN);

    if (match(TK_PASS)) {

    } else {
        while (match(TK_ID)) {
            name = *matched;
            expect(TK_COLON);
            type = parse_type();
            expect(TK_NEWLINE);
            s->addField(new StructField(name, type));
        }
    }

    expect(TK_END);

    return s;
}